

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall ManifestParser::ParseDefault(ManifestParser *this,string *err)

{
  long *plVar1;
  StringPiece path_00;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer ppVar6;
  byte unaff_BPL;
  string default_err;
  string path;
  EvalString eval;
  uint64_t slash_bits;
  string local_a8;
  Lexer *local_88;
  string local_80;
  ManifestParser *local_60;
  EvalString local_58;
  uint64_t local_38;
  
  local_58.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = &(this->super_Parser).lexer_;
  local_60 = this;
  bVar4 = Lexer::ReadEvalString(local_88,&local_58,true,err);
  if (bVar4) {
    if (local_58.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_58.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"expected target name","")
      ;
      unaff_BPL = Lexer::Error(local_88,&local_80,err);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      do {
        EvalString::Evaluate_abi_cxx11_(&local_80,&local_58,&local_60->env_->super_Env);
        if (local_80._M_string_length == 0) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"empty path","");
          unaff_BPL = Lexer::Error(local_88,&local_a8,err);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
          bVar4 = false;
        }
        else {
          CanonicalizePath(&local_80,&local_38);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          path_00.len_ = local_80._M_string_length;
          path_00.str_ = local_80._M_dataplus._M_p;
          bVar4 = State::AddDefault((local_60->super_Parser).state_,path_00,&local_a8);
          ppVar3 = local_58.parsed_.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ppVar2 = local_58.parsed_.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (bVar4) {
            if (local_58.parsed_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_58.parsed_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar5 = &((local_58.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first).field_2;
              do {
                plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar5 + -1))->_M_dataplus)._M_p;
                if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)plVar1) {
                  operator_delete(plVar1,paVar5->_M_allocated_capacity + 1);
                }
                ppVar6 = (pointer)((long)paVar5 + 0x18);
                paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)((long)paVar5 + 0x28);
              } while (ppVar6 != ppVar3);
              local_58.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
            }
            bVar4 = Lexer::ReadEvalString(local_88,&local_58,true,err);
            unaff_BPL = unaff_BPL & bVar4;
          }
          else {
            unaff_BPL = Lexer::Error(local_88,&local_a8,err);
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (bVar4 == false) goto LAB_00120c81;
      } while (local_58.parsed_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_58.parsed_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      unaff_BPL = Parser::ExpectToken(&local_60->super_Parser,NEWLINE,err);
    }
  }
  else {
    unaff_BPL = false;
  }
LAB_00120c81:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_58.parsed_);
  return (bool)unaff_BPL;
}

Assistant:

bool ManifestParser::ParseDefault(string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  if (eval.empty())
    return lexer_.Error("expected target name", err);

  do {
    string path = eval.Evaluate(env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;  // Unused because this only does lookup.
    CanonicalizePath(&path, &slash_bits);
    std::string default_err;
    if (!state_->AddDefault(path, &default_err))
      return lexer_.Error(default_err, err);

    eval.Clear();
    if (!lexer_.ReadPath(&eval, err))
      return false;
  } while (!eval.empty());

  return ExpectToken(Lexer::NEWLINE, err);
}